

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O0

Flow * __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::visitSIMDLoadStoreLane
          (Flow *__return_storage_ptr__,ModuleRunnerBase<wasm::ModuleRunner> *this,
          SIMDLoadStoreLane *curr)

{
  ExternalInterface *pEVar1;
  Name memory;
  address64_t aVar2;
  undefined1 this_00 [8];
  char *curr_00;
  bool bVar3;
  Index bytes;
  int32_t iVar4;
  uint32_t init;
  uint uVar5;
  int iVar6;
  ExpressionRunner<wasm::ModuleRunner> *pEVar7;
  Address memorySize_00;
  Literal *pLVar8;
  reference pvVar9;
  reference pvVar10;
  reference pvVar11;
  undefined4 extraout_var;
  reference pvVar12;
  int64_t iVar13;
  Literal local_590;
  undefined4 local_578;
  undefined4 uStack_574;
  undefined4 uStack_570;
  undefined4 uStack_56c;
  address64_t local_568;
  Literal local_560;
  undefined1 local_548 [8];
  array<wasm::Literal,_2UL> lanes_3;
  Literal local_500;
  undefined4 local_4e8;
  undefined4 uStack_4e4;
  undefined4 uStack_4e0;
  undefined4 uStack_4dc;
  address64_t local_4d8;
  Literal local_4d0;
  undefined1 local_4b8 [8];
  array<wasm::Literal,_4UL> lanes_2;
  Literal local_440;
  undefined4 local_428;
  undefined4 uStack_424;
  undefined4 uStack_420;
  undefined4 uStack_41c;
  address64_t local_418;
  Literal local_410;
  undefined1 local_3f8 [8];
  array<wasm::Literal,_8UL> lanes_1;
  Literal local_320;
  undefined4 local_308;
  undefined4 uStack_304;
  undefined4 uStack_300;
  undefined4 uStack_2fc;
  address64_t local_2f0;
  Literal local_2e8;
  undefined1 local_2d0 [8];
  array<wasm::Literal,_16UL> lanes;
  Literal vec;
  Literal local_e8;
  address64_t local_d0;
  Address addr;
  Address memorySize;
  undefined1 local_90 [8];
  MemoryInstanceInfo info;
  undefined1 local_68 [8];
  Flow flow;
  SIMDLoadStoreLane *curr_local;
  ModuleRunnerBase<wasm::ModuleRunner> *this_local;
  
  flow.breakTo.super_IString.str._M_str = (char *)curr;
  pEVar7 = (ExpressionRunner<wasm::ModuleRunner> *)self(this);
  ExpressionRunner<wasm::ModuleRunner>::visit
            ((Flow *)local_68,pEVar7,*(Expression **)(flow.breakTo.super_IString.str._M_str + 0x30))
  ;
  bVar3 = Flow::breaking((Flow *)local_68);
  if (bVar3) {
    Flow::Flow(__return_storage_ptr__,(Flow *)local_68);
    info.name.super_IString.str._M_str._0_4_ = 1;
  }
  else {
    getMemoryInstanceInfo
              ((MemoryInstanceInfo *)local_90,this,
               (Name)((IString *)(flow.breakTo.super_IString.str._M_str + 0x40))->str);
    memory.super_IString.str._M_len._4_4_ = info.instance._4_4_;
    memory.super_IString.str._M_len._0_4_ = info.instance._0_4_;
    memory.super_IString.str._M_str._4_4_ = info.name.super_IString.str._M_len._4_4_;
    memory.super_IString.str._M_str._0_4_ = (undefined4)info.name.super_IString.str._M_len;
    memorySize_00 = getMemorySize((ModuleRunnerBase<wasm::ModuleRunner> *)local_90,memory);
    curr_00 = flow.breakTo.super_IString.str._M_str;
    this_00 = local_90;
    pLVar8 = Flow::getSingleValue((Flow *)local_68);
    wasm::Literal::Literal(&local_e8,pLVar8);
    bytes = SIMDLoadStoreLane::getMemBytes
                      ((SIMDLoadStoreLane *)flow.breakTo.super_IString.str._M_str);
    local_d0 = (address64_t)
               getFinalAddress<wasm::SIMDLoadStoreLane>
                         ((ModuleRunnerBase<wasm::ModuleRunner> *)this_00,
                          (SIMDLoadStoreLane *)curr_00,&local_e8,bytes,memorySize_00);
    wasm::Literal::~Literal(&local_e8);
    pEVar7 = (ExpressionRunner<wasm::ModuleRunner> *)self(this);
    ExpressionRunner<wasm::ModuleRunner>::visit
              ((Flow *)&vec.type,pEVar7,
               *(Expression **)(flow.breakTo.super_IString.str._M_str + 0x38));
    Flow::operator=((Flow *)local_68,(Flow *)&vec.type);
    Flow::~Flow((Flow *)&vec.type);
    bVar3 = Flow::breaking((Flow *)local_68);
    if (bVar3) {
      Flow::Flow(__return_storage_ptr__,(Flow *)local_68);
      info.name.super_IString.str._M_str._0_4_ = 1;
    }
    else {
      pLVar8 = Flow::getSingleValue((Flow *)local_68);
      wasm::Literal::Literal((Literal *)&lanes._M_elems[0xf].type,pLVar8);
      switch(*(undefined4 *)(flow.breakTo.super_IString.str._M_str + 0x10)) {
      case 0:
      case 4:
        wasm::Literal::getLanesUI8x16
                  ((LaneArray<16> *)local_2d0,(Literal *)&lanes._M_elems[0xf].type);
        bVar3 = SIMDLoadStoreLane::isLoad
                          ((SIMDLoadStoreLane *)flow.breakTo.super_IString.str._M_str);
        aVar2 = local_d0;
        if (bVar3) {
          local_2f0 = local_d0;
          local_308 = info.instance._0_4_;
          uStack_304 = info.instance._4_4_;
          uStack_300 = (undefined4)info.name.super_IString.str._M_len;
          uStack_2fc = info.name.super_IString.str._M_len._4_4_;
          uVar5 = (*(*(ExternalInterface **)((long)local_90 + 0x288))->_vptr_ExternalInterface[0xe])
                            (*(ExternalInterface **)((long)local_90 + 0x288),local_d0,
                             CONCAT44(info.instance._4_4_,info.instance._0_4_),
                             CONCAT44(info.name.super_IString.str._M_len._4_4_,
                                      (undefined4)info.name.super_IString.str._M_len));
          wasm::Literal::Literal(&local_2e8,uVar5 & 0xff);
          pvVar9 = std::array<wasm::Literal,_16UL>::operator[]
                             ((array<wasm::Literal,_16UL> *)local_2d0,
                              (ulong)(byte)flow.breakTo.super_IString.str._M_str[0x28]);
          wasm::Literal::operator=(pvVar9,&local_2e8);
          wasm::Literal::~Literal(&local_2e8);
          wasm::Literal::Literal(&local_320,(LaneArray<16> *)local_2d0);
          Flow::Flow(__return_storage_ptr__,&local_320);
          wasm::Literal::~Literal(&local_320);
        }
        else {
          pEVar1 = *(ExternalInterface **)((long)local_90 + 0x288);
          pvVar9 = std::array<wasm::Literal,_16UL>::operator[]
                             ((array<wasm::Literal,_16UL> *)local_2d0,
                              (ulong)(byte)flow.breakTo.super_IString.str._M_str[0x28]);
          iVar4 = wasm::Literal::geti32(pvVar9);
          lanes_1._M_elems[7].type.id._0_4_ = info.instance._0_4_;
          lanes_1._M_elems[7].type.id._4_4_ = info.instance._4_4_;
          (*pEVar1->_vptr_ExternalInterface[0x16])
                    (pEVar1,aVar2,(ulong)(uint)(int)(char)iVar4,
                     CONCAT44(info.instance._4_4_,info.instance._0_4_),
                     CONCAT44(info.name.super_IString.str._M_len._4_4_,
                              (undefined4)info.name.super_IString.str._M_len));
          Flow::Flow(__return_storage_ptr__);
        }
        info.name.super_IString.str._M_str._0_4_ = 1;
        std::array<wasm::Literal,_16UL>::~array((array<wasm::Literal,_16UL> *)local_2d0);
        break;
      case 1:
      case 5:
        wasm::Literal::getLanesUI16x8
                  ((LaneArray<8> *)local_3f8,(Literal *)&lanes._M_elems[0xf].type);
        bVar3 = SIMDLoadStoreLane::isLoad
                          ((SIMDLoadStoreLane *)flow.breakTo.super_IString.str._M_str);
        aVar2 = local_d0;
        if (bVar3) {
          local_418 = local_d0;
          local_428 = info.instance._0_4_;
          uStack_424 = info.instance._4_4_;
          uStack_420 = (undefined4)info.name.super_IString.str._M_len;
          uStack_41c = info.name.super_IString.str._M_len._4_4_;
          uVar5 = (*(*(ExternalInterface **)((long)local_90 + 0x288))->_vptr_ExternalInterface[0x10]
                  )(*(ExternalInterface **)((long)local_90 + 0x288),local_d0,
                    CONCAT44(info.instance._4_4_,info.instance._0_4_),
                    CONCAT44(info.name.super_IString.str._M_len._4_4_,
                             (undefined4)info.name.super_IString.str._M_len));
          wasm::Literal::Literal(&local_410,uVar5 & 0xffff);
          pvVar10 = std::array<wasm::Literal,_8UL>::operator[]
                              ((array<wasm::Literal,_8UL> *)local_3f8,
                               (ulong)(byte)flow.breakTo.super_IString.str._M_str[0x28]);
          wasm::Literal::operator=(pvVar10,&local_410);
          wasm::Literal::~Literal(&local_410);
          wasm::Literal::Literal(&local_440,(LaneArray<8> *)local_3f8);
          Flow::Flow(__return_storage_ptr__,&local_440);
          wasm::Literal::~Literal(&local_440);
        }
        else {
          pEVar1 = *(ExternalInterface **)((long)local_90 + 0x288);
          pvVar10 = std::array<wasm::Literal,_8UL>::operator[]
                              ((array<wasm::Literal,_8UL> *)local_3f8,
                               (ulong)(byte)flow.breakTo.super_IString.str._M_str[0x28]);
          iVar4 = wasm::Literal::geti32(pvVar10);
          lanes_2._M_elems[3].type.id._0_4_ = info.instance._0_4_;
          lanes_2._M_elems[3].type.id._4_4_ = info.instance._4_4_;
          (*pEVar1->_vptr_ExternalInterface[0x17])
                    (pEVar1,aVar2,(ulong)(uint)(int)(short)iVar4,
                     CONCAT44(info.instance._4_4_,info.instance._0_4_),
                     CONCAT44(info.name.super_IString.str._M_len._4_4_,
                              (undefined4)info.name.super_IString.str._M_len));
          Flow::Flow(__return_storage_ptr__);
        }
        info.name.super_IString.str._M_str._0_4_ = 1;
        std::array<wasm::Literal,_8UL>::~array((array<wasm::Literal,_8UL> *)local_3f8);
        break;
      case 2:
      case 6:
        wasm::Literal::getLanesI32x4((LaneArray<4> *)local_4b8,(Literal *)&lanes._M_elems[0xf].type)
        ;
        bVar3 = SIMDLoadStoreLane::isLoad
                          ((SIMDLoadStoreLane *)flow.breakTo.super_IString.str._M_str);
        aVar2 = local_d0;
        if (bVar3) {
          local_4d8 = local_d0;
          local_4e8 = info.instance._0_4_;
          uStack_4e4 = info.instance._4_4_;
          uStack_4e0 = (undefined4)info.name.super_IString.str._M_len;
          uStack_4dc = info.name.super_IString.str._M_len._4_4_;
          init = (*(*(ExternalInterface **)((long)local_90 + 0x288))->_vptr_ExternalInterface[0x12])
                           (*(ExternalInterface **)((long)local_90 + 0x288),local_d0,
                            CONCAT44(info.instance._4_4_,info.instance._0_4_),
                            CONCAT44(info.name.super_IString.str._M_len._4_4_,
                                     (undefined4)info.name.super_IString.str._M_len));
          wasm::Literal::Literal(&local_4d0,init);
          pvVar11 = std::array<wasm::Literal,_4UL>::operator[]
                              ((array<wasm::Literal,_4UL> *)local_4b8,
                               (ulong)(byte)flow.breakTo.super_IString.str._M_str[0x28]);
          wasm::Literal::operator=(pvVar11,&local_4d0);
          wasm::Literal::~Literal(&local_4d0);
          wasm::Literal::Literal(&local_500,(LaneArray<4> *)local_4b8);
          Flow::Flow(__return_storage_ptr__,&local_500);
          wasm::Literal::~Literal(&local_500);
        }
        else {
          pEVar1 = *(ExternalInterface **)((long)local_90 + 0x288);
          pvVar11 = std::array<wasm::Literal,_4UL>::operator[]
                              ((array<wasm::Literal,_4UL> *)local_4b8,
                               (ulong)(byte)flow.breakTo.super_IString.str._M_str[0x28]);
          uVar5 = wasm::Literal::geti32(pvVar11);
          lanes_3._M_elems[1].type.id._0_4_ = info.instance._0_4_;
          lanes_3._M_elems[1].type.id._4_4_ = info.instance._4_4_;
          (*pEVar1->_vptr_ExternalInterface[0x18])
                    (pEVar1,aVar2,(ulong)uVar5,CONCAT44(info.instance._4_4_,info.instance._0_4_),
                     CONCAT44(info.name.super_IString.str._M_len._4_4_,
                              (undefined4)info.name.super_IString.str._M_len));
          Flow::Flow(__return_storage_ptr__);
        }
        info.name.super_IString.str._M_str._0_4_ = 1;
        std::array<wasm::Literal,_4UL>::~array((array<wasm::Literal,_4UL> *)local_4b8);
        break;
      case 3:
      case 7:
        wasm::Literal::getLanesI64x2((LaneArray<2> *)local_548,(Literal *)&lanes._M_elems[0xf].type)
        ;
        bVar3 = SIMDLoadStoreLane::isLoad
                          ((SIMDLoadStoreLane *)flow.breakTo.super_IString.str._M_str);
        aVar2 = local_d0;
        if (bVar3) {
          local_568 = local_d0;
          local_578 = info.instance._0_4_;
          uStack_574 = info.instance._4_4_;
          uStack_570 = (undefined4)info.name.super_IString.str._M_len;
          uStack_56c = info.name.super_IString.str._M_len._4_4_;
          iVar6 = (*(*(ExternalInterface **)((long)local_90 + 0x288))->_vptr_ExternalInterface[0x14]
                  )(*(ExternalInterface **)((long)local_90 + 0x288),local_d0,
                    CONCAT44(info.instance._4_4_,info.instance._0_4_),
                    CONCAT44(info.name.super_IString.str._M_len._4_4_,
                             (undefined4)info.name.super_IString.str._M_len));
          wasm::Literal::Literal(&local_560,CONCAT44(extraout_var,iVar6));
          pvVar12 = std::array<wasm::Literal,_2UL>::operator[]
                              ((array<wasm::Literal,_2UL> *)local_548,
                               (ulong)(byte)flow.breakTo.super_IString.str._M_str[0x28]);
          wasm::Literal::operator=(pvVar12,&local_560);
          wasm::Literal::~Literal(&local_560);
          wasm::Literal::Literal(&local_590,(LaneArray<2> *)local_548);
          Flow::Flow(__return_storage_ptr__,&local_590);
          wasm::Literal::~Literal(&local_590);
        }
        else {
          pEVar1 = *(ExternalInterface **)((long)local_90 + 0x288);
          pvVar12 = std::array<wasm::Literal,_2UL>::operator[]
                              ((array<wasm::Literal,_2UL> *)local_548,
                               (ulong)(byte)flow.breakTo.super_IString.str._M_str[0x28]);
          iVar13 = wasm::Literal::geti64(pvVar12);
          (*pEVar1->_vptr_ExternalInterface[0x19])
                    (pEVar1,aVar2,iVar13,CONCAT44(info.instance._4_4_,info.instance._0_4_),
                     CONCAT44(info.name.super_IString.str._M_len._4_4_,
                              (undefined4)info.name.super_IString.str._M_len));
          Flow::Flow(__return_storage_ptr__);
        }
        info.name.super_IString.str._M_str._0_4_ = 1;
        std::array<wasm::Literal,_2UL>::~array((array<wasm::Literal,_2UL> *)local_548);
        break;
      default:
        handle_unreachable("unexpected op",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-interpreter.h"
                           ,0xd3b);
      }
      wasm::Literal::~Literal((Literal *)&lanes._M_elems[0xf].type);
    }
  }
  Flow::~Flow((Flow *)local_68);
  return __return_storage_ptr__;
}

Assistant:

Flow visitSIMDLoadStoreLane(SIMDLoadStoreLane* curr) {
    NOTE_ENTER("SIMDLoadStoreLane");
    Flow flow = self()->visit(curr->ptr);
    if (flow.breaking()) {
      return flow;
    }
    NOTE_EVAL1(flow);
    auto info = getMemoryInstanceInfo(curr->memory);
    auto memorySize = info.instance->getMemorySize(info.name);
    Address addr = info.instance->getFinalAddress(
      curr, flow.getSingleValue(), curr->getMemBytes(), memorySize);
    flow = self()->visit(curr->vec);
    if (flow.breaking()) {
      return flow;
    }
    Literal vec = flow.getSingleValue();
    switch (curr->op) {
      case Load8LaneVec128:
      case Store8LaneVec128: {
        std::array<Literal, 16> lanes = vec.getLanesUI8x16();
        if (curr->isLoad()) {
          lanes[curr->index] =
            Literal(info.instance->externalInterface->load8u(addr, info.name));
          return Literal(lanes);
        } else {
          info.instance->externalInterface->store8(
            addr, lanes[curr->index].geti32(), info.name);
          return {};
        }
      }
      case Load16LaneVec128:
      case Store16LaneVec128: {
        std::array<Literal, 8> lanes = vec.getLanesUI16x8();
        if (curr->isLoad()) {
          lanes[curr->index] =
            Literal(info.instance->externalInterface->load16u(addr, info.name));
          return Literal(lanes);
        } else {
          info.instance->externalInterface->store16(
            addr, lanes[curr->index].geti32(), info.name);
          return {};
        }
      }
      case Load32LaneVec128:
      case Store32LaneVec128: {
        std::array<Literal, 4> lanes = vec.getLanesI32x4();
        if (curr->isLoad()) {
          lanes[curr->index] =
            Literal(info.instance->externalInterface->load32u(addr, info.name));
          return Literal(lanes);
        } else {
          info.instance->externalInterface->store32(
            addr, lanes[curr->index].geti32(), info.name);
          return {};
        }
      }
      case Store64LaneVec128:
      case Load64LaneVec128: {
        std::array<Literal, 2> lanes = vec.getLanesI64x2();
        if (curr->isLoad()) {
          lanes[curr->index] =
            Literal(info.instance->externalInterface->load64u(addr, info.name));
          return Literal(lanes);
        } else {
          info.instance->externalInterface->store64(
            addr, lanes[curr->index].geti64(), info.name);
          return {};
        }
      }
    }
    WASM_UNREACHABLE("unexpected op");
  }